

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O3

TPZAutoPointer<TPZMatrix<float>_> __thiscall
TPZSTShiftOrigin<float>::CalcMatrix
          (TPZSTShiftOrigin<float> *this,TPZAutoPointer<TPZMatrix<float>_> *A)

{
  TPZSpectralTransform<float> TVar1;
  long lVar2;
  long *plVar3;
  TPZSpectralTransform<float> *in_RDX;
  long lVar4;
  undefined1 local_34 [4];
  
  TVar1 = *in_RDX;
  lVar2 = *(long *)(*(long *)TVar1 + 8);
  this->super_TPZSpectralTransform<float> = TVar1;
  LOCK();
  *(int *)((long)TVar1 + 8) = *(int *)((long)TVar1 + 8) + 1;
  UNLOCK();
  if (0 < lVar2) {
    TVar1 = this->super_TPZSpectralTransform<float>;
    lVar4 = 0;
    do {
      plVar3 = *(long **)TVar1;
      (**(code **)(*plVar3 + 0x120))(plVar3,lVar4,lVar4);
      (**(code **)(*plVar3 + 0x118))(plVar3,lVar4,lVar4,local_34);
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  return (TPZAutoPointer<TPZMatrix<float>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A) const
{
  const auto nRows = A->Rows();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //calculating A-sigmaB
  const auto &shift = Shift();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}